

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O2

FieldBase * __thiscall FIX::FieldBase::operator=(FieldBase *this,FieldBase *rhs)

{
  this->m_tag = rhs->m_tag;
  std::__cxx11::string::_M_assign((string *)&this->m_string);
  (this->m_metrics).m_checksum = (rhs->m_metrics).m_checksum;
  (this->m_metrics).m_length = (rhs->m_metrics).m_length;
  (this->m_data)._M_string_length = 0;
  *(this->m_data)._M_dataplus._M_p = '\0';
  return this;
}

Assistant:

FieldBase& operator=( const FieldBase& rhs)
  {
    m_tag = rhs.getTag();
    m_string = rhs.m_string;
    m_metrics = rhs.m_metrics;
    m_data.clear();

    return *this;
  }